

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

int AF_A_GunFlash(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AWeapon *pAVar1;
  int iVar2;
  bool bVar3;
  bool local_76;
  bool local_73;
  FName local_70;
  FName local_6c;
  player_t *local_68;
  player_t *player;
  FState *pFStack_58;
  int flags;
  FState *flash;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x4c2,"int AF_A_GunFlash(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x4c2,"int AF_A_GunFlash(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  stateowner = (AActor *)(param->field_0).field_1.a;
  local_73 = true;
  if (stateowner != (AActor *)0x0) {
    local_73 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
  }
  if (local_73 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x4c2,"int AF_A_GunFlash(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  self._0_4_ = (int)self + 1;
  if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
    bVar3 = false;
    if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
      bVar3 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x4c2,"int AF_A_GunFlash(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
    local_76 = true;
    if ((DObject *)stateinfo != (DObject *)0x0) {
      local_76 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
    }
    if (local_76 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x4c2,"int AF_A_GunFlash(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  else {
    stateinfo = (FStateParamInfo *)stateowner;
  }
  iVar2 = (int)self + 1;
  if ((iVar2 < ret_local._4_4_) && (pVStack_20[iVar2].field_0.field_3.Type != 0xff)) {
    bVar3 = false;
    if ((pVStack_20[iVar2].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, pVStack_20[iVar2].field_0.field_1.atag != 8)) {
      bVar3 = pVStack_20[iVar2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      self._0_4_ = iVar2;
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x4c2,"int AF_A_GunFlash(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    flash = (FState *)pVStack_20[iVar2].field_0.field_1.a;
  }
  else {
    flash = (FState *)0x0;
  }
  iVar2 = (int)self + 2;
  if ((iVar2 < ret_local._4_4_) && (pVStack_20[iVar2].field_0.field_3.Type != 0xff)) {
    bVar3 = false;
    if ((pVStack_20[iVar2].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, pVStack_20[iVar2].field_0.field_1.atag != 7)) {
      bVar3 = pVStack_20[iVar2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      self._0_4_ = iVar2;
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x4c3,"int AF_A_GunFlash(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    pFStack_58 = (FState *)pVStack_20[iVar2].field_0.field_1.a;
  }
  else {
    pFStack_58 = (FState *)0x0;
  }
  self._0_4_ = (int)self + 3;
  if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
    if (pVStack_20[(int)self].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x4c4,"int AF_A_GunFlash(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    player._4_4_ = pVStack_20[(int)self].field_0.i;
  }
  else {
    player._4_4_ = 0;
  }
  local_68 = stateowner->player;
  if (local_68 != (player_t *)0x0) {
    if ((player._4_4_ & 1) == 0) {
      APlayerPawn::PlayAttacking2(local_68->mo);
    }
    if (pFStack_58 == (FState *)0x0) {
      if ((local_68->ReadyWeapon->bAltFire & 1U) != 0) {
        pAVar1 = local_68->ReadyWeapon;
        FName::FName(&local_6c,NAME_AltFlash);
        pFStack_58 = AActor::FindState((AActor *)pAVar1,&local_6c);
      }
      if (pFStack_58 == (FState *)0x0) {
        pAVar1 = local_68->ReadyWeapon;
        FName::FName(&local_70,NAME_Flash);
        pFStack_58 = AActor::FindState((AActor *)pAVar1,&local_70);
      }
    }
    P_SetPsprite(local_68,PSP_FLASH,pFStack_58,false);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AInventory, A_GunFlash)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_STATE_OPT(flash)	{ flash = nullptr; }
	PARAM_INT_OPT  (flags)	{ flags = 0; }

	player_t *player = self->player;

	if (nullptr == player)
	{
		return 0;
	}
	if (!(flags & GFF_NOEXTCHANGE))
	{
		player->mo->PlayAttacking2 ();
	}
	if (flash == nullptr)
	{
		if (player->ReadyWeapon->bAltFire)
		{
			flash = player->ReadyWeapon->FindState(NAME_AltFlash);
		}
		if (flash == nullptr)
		{
			flash = player->ReadyWeapon->FindState(NAME_Flash);
		}
	}
	P_SetPsprite(player, PSP_FLASH, flash);
	return 0;
}